

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O2

bool duckdb::DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,true>
               (DecimalCastData<duckdb::hugeint_t> *state)

{
  bool bVar1;
  ExponentType EVar2;
  uint8_t uVar3;
  byte bVar4;
  hugeint_t local_30;
  
  EVar2 = state->exponent_type;
  if ((EVar2 != POSITIVE) &&
     (uVar3 = state->decimal_count - state->scale,
     state->scale <= state->decimal_count && uVar3 != '\0')) {
    state->excessive_decimals = uVar3;
  }
  if (state->excessive_decimals != '\0') {
    bVar1 = TruncateExcessiveDecimals<duckdb::DecimalCastData<duckdb::hugeint_t>,true>(state);
    if (!bVar1) {
      return false;
    }
    EVar2 = state->exponent_type;
  }
  if (((EVar2 == NONE) && (state->round_set == true)) && (state->should_round == true)) {
    RoundUpResult<duckdb::DecimalCastData<duckdb::hugeint_t>,true>(state);
  }
  for (bVar4 = state->decimal_count; bVar4 < state->scale; bVar4 = bVar4 + 1) {
    hugeint_t::hugeint_t(&local_30,10);
    hugeint_t::operator*=(&state->result,&local_30);
  }
  local_30 = hugeint_t::operator-(&state->limit);
  bVar1 = hugeint_t::operator>(&state->result,&local_30);
  return bVar1;
}

Assistant:

static bool Finalize(T &state) {
		if (state.exponent_type != ExponentType::POSITIVE && state.decimal_count > state.scale) {
			//! Did not encounter an exponent, but ALLOW_EXPONENT was on
			state.excessive_decimals = state.decimal_count - state.scale;
		}
		if (state.excessive_decimals && !TruncateExcessiveDecimals<T, NEGATIVE>(state)) {
			return false;
		}
		if (state.exponent_type == ExponentType::NONE && state.round_set && state.should_round) {
			RoundUpResult<T, NEGATIVE>(state);
		}
		//  if we have not gotten exactly "scale" decimals, we need to multiply the result
		//  e.g. if we have a string "1.0" that is cast to a DECIMAL(9,3), the value needs to be 1000
		//  but we have only gotten the value "10" so far, so we multiply by 1000
		for (uint8_t i = state.decimal_count; i < state.scale; i++) {
			state.result *= 10;
		}
		if (NEGATIVE) {
			return state.result > -state.limit;
		} else {
			return state.result < state.limit;
		}
	}